

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O2

stbir_uint8 stbir__linear_to_srgb_uchar(float in)

{
  stbir_uint8 sVar1;
  
  if (0.00012207031 < in) {
    sVar1 = 0xff;
    if (in <= 0.99999994) {
      sVar1 = (stbir_uint8)
              (((uint)in >> 0xc & 0xff) *
               (fp32_to_srgb8_tab4[(int)in + 0xc7000000U >> 0x14] & 0xffff) +
               (fp32_to_srgb8_tab4[(int)in + 0xc7000000U >> 0x14] >> 7 & 0xfffe00) >> 0x10);
    }
    return sVar1;
  }
  return '\0';
}

Assistant:

static stbir__inline stbir_uint8 stbir__linear_to_srgb_uchar(float in)
{
  static const stbir__FP32 almostone = { 0x3f7fffff }; // 1-eps
  static const stbir__FP32 minval = { (127-13) << 23 };
  stbir_uint32 tab,bias,scale,t;
  stbir__FP32 f;

  // Clamp to [2^(-13), 1-eps]; these two values map to 0 and 1, respectively.
  // The tests are carefully written so that NaNs map to 0, same as in the reference
  // implementation.
  if (!(in > minval.f)) // written this way to catch NaNs
      return 0;
  if (in > almostone.f)
      return 255;

  // Do the table lookup and unpack bias, scale
  f.f = in;
  tab = fp32_to_srgb8_tab4[(f.u - minval.u) >> 20];
  bias = (tab >> 16) << 9;
  scale = tab & 0xffff;

  // Grab next-highest mantissa bits and perform linear interpolation
  t = (f.u >> 12) & 0xff;
  return (unsigned char) ((bias + scale*t) >> 16);
}